

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * __thiscall minja::Context::at(Context *this,Value *key)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  runtime_error *this_00;
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Value *in_stack_00000040;
  Value *in_stack_00000048;
  Value *in_stack_00000070;
  Value *in_stack_00000078;
  bool in_stack_00000133;
  int in_stack_00000134;
  Value *in_stack_00000138;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff9c;
  string local_38 [32];
  undefined8 local_18;
  Value *local_8;
  
  local_18 = in_RSI;
  bVar1 = Value::contains(in_stack_00000078,in_stack_00000070);
  if (bVar1) {
    local_8 = Value::at(in_stack_00000048,in_stack_00000040);
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI[3]._M_string_length);
    if (!bVar1) {
      uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffff98);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      Value::dump_abi_cxx11_(in_stack_00000138,in_stack_00000134,in_stack_00000133);
      std::operator+((char *)CONCAT44(in_stack_ffffffffffffff9c,uVar4),in_RDI);
      std::runtime_error::runtime_error(this_00,local_38);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar3 = std::__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2bd16b);
    iVar2 = (*peVar3->_vptr_Context[3])(peVar3,local_18);
    local_8 = (Value *)CONCAT44(extraout_var,iVar2);
  }
  return local_8;
}

Assistant:

virtual Value & at(const Value & key) {
        if (values_.contains(key)) return values_.at(key);
        if (parent_) return parent_->at(key);
        throw std::runtime_error("Undefined variable: " + key.dump());
    }